

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward.c
# Opt level: O1

void den_terms_ci(float64 **d_term,float64 post_j,float64 *p_ci_op,float64 **den,uint32 **den_idx,
                 float32 **mixw,uint32 n_feat,uint32 n_top)

{
  double dVar1;
  uint32 *puVar2;
  float32 *pfVar3;
  float64 *pfVar4;
  float64 *pfVar5;
  ulong uVar6;
  ulong uVar7;
  
  if (n_feat != 0) {
    uVar7 = 0;
    do {
      dVar1 = (double)p_ci_op[uVar7];
      if ((dVar1 != 0.0) || (NAN(dVar1))) {
        if (n_top != 0) {
          puVar2 = den_idx[uVar7];
          pfVar3 = mixw[uVar7];
          pfVar4 = den[uVar7];
          pfVar5 = d_term[uVar7];
          uVar6 = 0;
          do {
            pfVar5[uVar6] =
                 (float64)((double)(float)pfVar3[puVar2[uVar6]] * (double)pfVar4[uVar6] *
                           (1.0 / dVar1) * (double)post_j);
            uVar6 = uVar6 + 1;
          } while (n_top != uVar6);
        }
      }
      else if (n_top != 0) {
        memset(d_term[uVar7],0,(ulong)n_top * 8);
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != n_feat);
  }
  return;
}

Assistant:

void
den_terms_ci(float64 **d_term,

	     float64 post_j,
	     float64 *p_ci_op,
	     float64 **den,
	     uint32  **den_idx,
	     float32 **mixw,
	     uint32 n_feat,
	     uint32 n_top)
{
    uint32 j, k, kk;
    float64 inv_ci_op;

    for (j = 0; j < n_feat; j++) {
	if (p_ci_op[j] != 0) {
	    inv_ci_op = 1.0 / p_ci_op[j];

	    for (kk = 0; kk < n_top; kk++) {
		/* density index k for one of the n_top density values */
		k = den_idx[j][kk];
		
		d_term[j][kk] = mixw[j][k] * den[j][kk] * inv_ci_op * post_j;
	    }
	}
	else {
	    for (kk = 0; kk < n_top; kk++) {
		d_term[j][kk] = 0;
	    }
	}
    }
}